

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_ellswift_create(void *arg,int iters)

{
  int iVar1;
  int iVar2;
  uchar buf [64];
  
  iVar2 = 0;
  if (0 < iters) {
    iVar2 = iters;
  }
  while( true ) {
    if (iVar2 == 0) {
      return;
    }
    iVar1 = secp256k1_ellswift_create(*arg,buf,(uchar *)((long)arg + 0x4008),(long)arg + 0x4028);
    if (iVar1 == 0) break;
    *(undefined8 *)((long)arg + 0x4038) = buf._48_8_;
    *(undefined8 *)((long)arg + 0x4040) = buf._56_8_;
    *(undefined8 *)((long)arg + 0x4028) = buf._32_8_;
    *(undefined8 *)((long)arg + 0x4030) = buf._40_8_;
    *(undefined8 *)((long)arg + 0x4018) = buf._16_8_;
    *(undefined8 *)((long)arg + 0x4020) = buf._24_8_;
    *(undefined8 *)((long)arg + 0x4008) = buf._0_8_;
    *(undefined8 *)((long)arg + 0x4010) = buf._8_8_;
    iVar2 = iVar2 + -1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ellswift/bench_impl.h"
          ,0x38,
          "test condition failed: secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32)"
         );
  abort();
}

Assistant:

static void bench_ellswift_create(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char buf[64];
        CHECK(secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32));
        memcpy(data->rnd64, buf, 64);
    }
}